

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

_Bool run_container_iterate(run_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  uint32_t uVar4;
  
  if (0 < cont->n_runs) {
    lVar3 = 0;
    do {
      iVar2 = cont->runs[lVar3].length + 1;
      uVar4 = cont->runs[lVar3].value + base;
      do {
        _Var1 = (*iterator)(uVar4,ptr);
        if (!_Var1) {
          return false;
        }
        uVar4 = uVar4 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < cont->n_runs);
  }
  return true;
}

Assistant:

bool run_container_iterate(const run_container_t *cont, uint32_t base,
                           roaring_iterator iterator, void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(run_start + j, ptr)) return false;
    }
    return true;
}